

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx512bw_adder_forest(uint16_t *array,uint32_t len,uint32_t *flags)

{
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int j_3;
  size_t i_4;
  int j_2;
  __m512i sum1415_8bit_odd_1;
  __m512i sum1415_8bit_even_1;
  __m512i sum1213_8bit_odd_1;
  __m512i sum1213_8bit_even_1;
  __m512i sum1011_8bit_odd_1;
  __m512i sum1011_8bit_even_1;
  __m512i sum89_8bit_odd_1;
  __m512i sum89_8bit_even_1;
  __m512i sum67_8bit_odd_1;
  __m512i sum67_8bit_even_1;
  __m512i sum45_8bit_odd_1;
  __m512i sum45_8bit_even_1;
  __m512i sum23_8bit_odd_1;
  __m512i sum23_8bit_even_1;
  __m512i sum01_8bit_odd_1;
  __m512i sum01_8bit_even_1;
  __m512i sum1415_4bit_odd_1;
  __m512i sum1415_4bit_even_1;
  __m512i sum1213_4bit_odd_1;
  __m512i sum1213_4bit_even_1;
  __m512i sum1011_4bit_odd_1;
  __m512i sum1011_4bit_even_1;
  __m512i sum89_4bit_odd_1;
  __m512i sum89_4bit_even_1;
  __m512i sum67_4bit_odd_1;
  __m512i sum67_4bit_even_1;
  __m512i sum45_4bit_odd_1;
  __m512i sum45_4bit_even_1;
  __m512i sum23_4bit_odd_1;
  __m512i sum23_4bit_even_1;
  __m512i sum01_4bit_odd_1;
  __m512i sum01_4bit_even_1;
  __m512i sum1415_2bit_odd_1;
  __m512i sum1415_2bit_even_1;
  __m512i sum1213_2bit_odd_1;
  __m512i sum1213_2bit_even_1;
  __m512i sum1011_2bit_odd_1;
  __m512i sum1011_2bit_even_1;
  __m512i sum89_2bit_odd_1;
  __m512i sum89_2bit_even_1;
  __m512i sum67_2bit_odd_1;
  __m512i sum67_2bit_even_1;
  __m512i sum45_2bit_odd_1;
  __m512i sum45_2bit_even_1;
  __m512i sum23_2bit_odd_1;
  __m512i sum23_2bit_even_1;
  __m512i sum01_2bit_odd_1;
  __m512i sum01_2bit_even_1;
  __m512i sum1415_1bit_odd_1;
  __m512i sum1415_1bit_even_1;
  __m512i sum1213_1bit_odd_1;
  __m512i sum1213_1bit_even_1;
  __m512i sum1011_1bit_odd_1;
  __m512i sum1011_1bit_even_1;
  __m512i sum89_1bit_odd_1;
  __m512i sum89_1bit_even_1;
  __m512i sum67_1bit_odd_1;
  __m512i sum67_1bit_even_1;
  __m512i sum45_1bit_odd_1;
  __m512i sum45_1bit_even_1;
  __m512i sum23_1bit_odd_1;
  __m512i sum23_1bit_even_1;
  __m512i sum01_1bit_odd_1;
  __m512i sum01_1bit_even_1;
  __m512i input15_1;
  __m512i input14_1;
  __m512i input13_1;
  __m512i input12_1;
  __m512i input11_1;
  __m512i input10_1;
  __m512i input9_1;
  __m512i input8_1;
  __m512i input7_1;
  __m512i input6_1;
  __m512i input5_1;
  __m512i input4_1;
  __m512i input3_1;
  __m512i input2_1;
  __m512i input1_1;
  __m512i input0_1;
  size_t i_3;
  int j_1;
  size_t i_2;
  __m512i sum1415_8bit_odd;
  __m512i sum1415_8bit_even;
  __m512i sum1213_8bit_odd;
  __m512i sum1213_8bit_even;
  __m512i sum1011_8bit_odd;
  __m512i sum1011_8bit_even;
  __m512i sum89_8bit_odd;
  __m512i sum89_8bit_even;
  __m512i sum67_8bit_odd;
  __m512i sum67_8bit_even;
  __m512i sum45_8bit_odd;
  __m512i sum45_8bit_even;
  __m512i sum23_8bit_odd;
  __m512i sum23_8bit_even;
  __m512i sum01_8bit_odd;
  __m512i sum01_8bit_even;
  __m512i sum1415_4bit_odd;
  __m512i sum1415_4bit_even;
  __m512i sum1213_4bit_odd;
  __m512i sum1213_4bit_even;
  __m512i sum1011_4bit_odd;
  __m512i sum1011_4bit_even;
  __m512i sum89_4bit_odd;
  __m512i sum89_4bit_even;
  __m512i sum67_4bit_odd;
  __m512i sum67_4bit_even;
  __m512i sum45_4bit_odd;
  __m512i sum45_4bit_even;
  __m512i sum23_4bit_odd;
  __m512i sum23_4bit_even;
  __m512i sum01_4bit_odd;
  __m512i sum01_4bit_even;
  __m512i sum1415_2bit_odd;
  __m512i sum1415_2bit_even;
  __m512i sum1213_2bit_odd;
  __m512i sum1213_2bit_even;
  __m512i sum1011_2bit_odd;
  __m512i sum1011_2bit_even;
  __m512i sum89_2bit_odd;
  __m512i sum89_2bit_even;
  __m512i sum67_2bit_odd;
  __m512i sum67_2bit_even;
  __m512i sum45_2bit_odd;
  __m512i sum45_2bit_even;
  __m512i sum23_2bit_odd;
  __m512i sum23_2bit_even;
  __m512i sum01_2bit_odd;
  __m512i sum01_2bit_even;
  __m512i sum1415_1bit_odd;
  __m512i sum1415_1bit_even;
  __m512i sum1213_1bit_odd;
  __m512i sum1213_1bit_even;
  __m512i sum1011_1bit_odd;
  __m512i sum1011_1bit_even;
  __m512i sum89_1bit_odd;
  __m512i sum89_1bit_even;
  __m512i sum67_1bit_odd;
  __m512i sum67_1bit_even;
  __m512i sum45_1bit_odd;
  __m512i sum45_1bit_even;
  __m512i sum23_1bit_odd;
  __m512i sum23_1bit_even;
  __m512i sum01_1bit_odd;
  __m512i sum01_1bit_even;
  __m512i input15;
  __m512i input14;
  __m512i input13;
  __m512i input12;
  __m512i input11;
  __m512i input10;
  __m512i input9;
  __m512i input8;
  __m512i input7;
  __m512i input6;
  __m512i input5;
  __m512i input4;
  __m512i input3;
  __m512i input2;
  __m512i input1;
  __m512i input0;
  int j;
  size_t i;
  uint16_t tmp [32];
  uint32_t n_total;
  uint32_t n_cycles;
  __m512i mask8bit;
  __m512i mask4bit;
  __m512i mask2bit;
  __m512i mask1bit;
  size_t i_1;
  __m512i counters [16];
  int local_c2d4;
  ulong local_c2d0;
  int local_c2c4;
  ulong local_ae98;
  int local_ae8c;
  ulong local_ae88;
  int local_9a5c;
  ulong local_9a58;
  undefined1 local_9a50 [6] [64];
  ulong local_98c8;
  undefined1 local_98c0 [64];
  undefined1 local_9880 [64];
  undefined1 local_9840 [64];
  undefined1 local_9800 [64];
  undefined1 local_97c0 [64];
  undefined1 local_9780 [64];
  undefined1 local_9740 [64];
  undefined1 local_9700 [64];
  undefined1 local_96c0 [64];
  undefined1 local_9680 [64];
  undefined1 local_9640 [64];
  undefined1 local_9600 [64];
  undefined1 local_95c0 [64];
  undefined1 local_9580 [64];
  undefined1 local_9540 [64];
  undefined1 local_9500 [64];
  
  for (local_98c8 = 0; local_98c8 < 0x10; local_98c8 = local_98c8 + 1) {
    auVar1 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    *(undefined1 (*) [64])(local_98c0 + local_98c8 * 0x40) = auVar1;
  }
  auVar1 = vpbroadcastw_avx512bw(ZEXT216(0x5555));
  auVar1 = vmovdqa64_avx512f(auVar1);
  auVar1 = vmovdqa64_avx512f(auVar1);
  auVar1 = vmovdqa64_avx512f(auVar1);
  auVar2 = vpbroadcastw_avx512bw(ZEXT216(0x3333));
  auVar2 = vmovdqa64_avx512f(auVar2);
  auVar2 = vmovdqa64_avx512f(auVar2);
  auVar2 = vmovdqa64_avx512f(auVar2);
  auVar3 = vpbroadcastw_avx512bw(ZEXT216(0xf0f));
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar3 = vmovdqa64_avx512f(auVar3);
  auVar4 = vpbroadcastw_avx512bw(ZEXT216(0xff));
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqa64_avx512f(auVar4);
  for (local_9a58 = 0; local_9a58 < in_ESI >> 0x14; local_9a58 = local_9a58 + 1) {
    for (local_9a5c = 0; local_9a5c < 0x800; local_9a5c = local_9a5c + 1) {
      auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2));
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                  0x40));
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                  0x80));
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                  0xc0));
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                  (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                  0x100));
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x140));
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x180));
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x1c0));
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x200));
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x240));
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x280));
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x2c0));
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x300));
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x340));
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x380));
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])
                                   (in_RDI + local_9a58 * 0x200000 + (long)(local_9a5c << 9) * 2 +
                                   0x3c0));
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar21 = vmovdqa64_avx512f(auVar5);
      auVar21 = vpandq_avx512f(auVar21,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar6);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vpaddb_avx512bw(auVar21,auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar5,auVar1);
      auVar5 = vmovdqa64_avx512f(auVar6);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(1));
      auVar6 = vpandq_avx512f(auVar5,auVar1);
      auVar5 = vmovdqa64_avx512f(auVar22);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar5 = vpaddb_avx512bw(auVar5,auVar6);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar6 = vmovdqa64_avx512f(auVar7);
      auVar6 = vpandq_avx512f(auVar6,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar8);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar6 = vpaddb_avx512bw(auVar6,auVar22);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar7,auVar1);
      auVar7 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(1));
      auVar8 = vpandq_avx512f(auVar7,auVar1);
      auVar7 = vmovdqa64_avx512f(auVar22);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddb_avx512bw(auVar7,auVar8);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar9);
      auVar8 = vpandq_avx512f(auVar8,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar10);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar8 = vpaddb_avx512bw(auVar8,auVar22);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar9,auVar1);
      auVar9 = vmovdqa64_avx512f(auVar10);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(1));
      auVar10 = vpandq_avx512f(auVar9,auVar1);
      auVar9 = vmovdqa64_avx512f(auVar22);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar9 = vpaddb_avx512bw(auVar9,auVar10);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar10 = vmovdqa64_avx512f(auVar11);
      auVar10 = vpandq_avx512f(auVar10,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar12);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar10 = vpaddb_avx512bw(auVar10,auVar22);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar11,auVar1);
      auVar11 = vmovdqa64_avx512f(auVar12);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(1));
      auVar12 = vpandq_avx512f(auVar11,auVar1);
      auVar11 = vmovdqa64_avx512f(auVar22);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vpaddb_avx512bw(auVar11,auVar12);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar13);
      auVar12 = vpandq_avx512f(auVar12,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar14);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar12 = vpaddb_avx512bw(auVar12,auVar22);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar13,auVar1);
      auVar13 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(1));
      auVar14 = vpandq_avx512f(auVar13,auVar1);
      auVar13 = vmovdqa64_avx512f(auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar13 = vpaddb_avx512bw(auVar13,auVar14);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar14 = vmovdqa64_avx512f(auVar15);
      auVar14 = vpandq_avx512f(auVar14,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar16);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar14 = vpaddb_avx512bw(auVar14,auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpsrlw_avx512bw(auVar15,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar15,auVar1);
      auVar15 = vmovdqa64_avx512f(auVar16);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpsrlw_avx512bw(auVar15,ZEXT416(1));
      auVar16 = vpandq_avx512f(auVar15,auVar1);
      auVar15 = vmovdqa64_avx512f(auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar15 = vpaddb_avx512bw(auVar15,auVar16);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar17);
      auVar16 = vpandq_avx512f(auVar16,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar18);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar16 = vpaddb_avx512bw(auVar16,auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar17,auVar1);
      auVar17 = vmovdqa64_avx512f(auVar18);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(1));
      auVar18 = vpandq_avx512f(auVar17,auVar1);
      auVar17 = vmovdqa64_avx512f(auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar17 = vpaddb_avx512bw(auVar17,auVar18);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar18 = vmovdqa64_avx512f(auVar19);
      auVar18 = vpandq_avx512f(auVar18,auVar1);
      auVar22 = vmovdqa64_avx512f(auVar20);
      auVar22 = vpandq_avx512f(auVar22,auVar1);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vpaddb_avx512bw(auVar18,auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(1));
      auVar22 = vpandq_avx512f(auVar19,auVar1);
      auVar19 = vmovdqa64_avx512f(auVar20);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(1));
      auVar20 = vpandq_avx512f(auVar19,auVar1);
      auVar19 = vmovdqa64_avx512f(auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar19 = vpaddb_avx512bw(auVar19,auVar20);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar20 = vmovdqa64_avx512f(auVar21);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar21 = vmovdqa64_avx512f(auVar20);
      auVar21 = vpandq_avx512f(auVar21,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar6);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vpaddb_avx512bw(auVar21,auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar20 = vpsrlw_avx512bw(auVar20,ZEXT416(2));
      auVar20 = vpandq_avx512f(auVar20,auVar2);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar6,auVar2);
      auVar6 = vmovdqa64_avx512f(auVar20);
      auVar20 = vmovdqa64_avx512f(auVar22);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar6 = vpaddb_avx512bw(auVar6,auVar20);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar20 = vmovdqa64_avx512f(auVar8);
      auVar20 = vpandq_avx512f(auVar20,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar10);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar20 = vpaddb_avx512bw(auVar20,auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsrlw_avx512bw(auVar8,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar8,auVar2);
      auVar8 = vmovdqa64_avx512f(auVar10);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsrlw_avx512bw(auVar8,ZEXT416(2));
      auVar10 = vpandq_avx512f(auVar8,auVar2);
      auVar8 = vmovdqa64_avx512f(auVar22);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar8 = vpaddb_avx512bw(auVar8,auVar10);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar10 = vmovdqa64_avx512f(auVar12);
      auVar10 = vpandq_avx512f(auVar10,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar14);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar10 = vpaddb_avx512bw(auVar10,auVar22);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar12,auVar2);
      auVar12 = vmovdqa64_avx512f(auVar14);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(2));
      auVar14 = vpandq_avx512f(auVar12,auVar2);
      auVar12 = vmovdqa64_avx512f(auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar12 = vpaddb_avx512bw(auVar12,auVar14);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar14 = vmovdqa64_avx512f(auVar16);
      auVar14 = vpandq_avx512f(auVar14,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar18);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar14 = vpaddb_avx512bw(auVar14,auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vpsrlw_avx512bw(auVar16,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar16,auVar2);
      auVar16 = vmovdqa64_avx512f(auVar18);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vpsrlw_avx512bw(auVar16,ZEXT416(2));
      auVar18 = vpandq_avx512f(auVar16,auVar2);
      auVar16 = vmovdqa64_avx512f(auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar16 = vpaddb_avx512bw(auVar16,auVar18);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar18 = vmovdqa64_avx512f(auVar5);
      auVar18 = vpandq_avx512f(auVar18,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar7);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vpaddb_avx512bw(auVar18,auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar5,auVar2);
      auVar5 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(2));
      auVar7 = vpandq_avx512f(auVar5,auVar2);
      auVar5 = vmovdqa64_avx512f(auVar22);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar5 = vpaddb_avx512bw(auVar5,auVar7);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar7 = vmovdqa64_avx512f(auVar9);
      auVar7 = vpandq_avx512f(auVar7,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar11);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar7 = vpaddb_avx512bw(auVar7,auVar22);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar9,auVar2);
      auVar9 = vmovdqa64_avx512f(auVar11);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(2));
      auVar11 = vpandq_avx512f(auVar9,auVar2);
      auVar9 = vmovdqa64_avx512f(auVar22);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar9 = vpaddb_avx512bw(auVar9,auVar11);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar11 = vmovdqa64_avx512f(auVar13);
      auVar11 = vpandq_avx512f(auVar11,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar15);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar11 = vpaddb_avx512bw(auVar11,auVar22);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar13,auVar2);
      auVar13 = vmovdqa64_avx512f(auVar15);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(2));
      auVar15 = vpandq_avx512f(auVar13,auVar2);
      auVar13 = vmovdqa64_avx512f(auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vpaddb_avx512bw(auVar13,auVar15);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar17);
      auVar15 = vpandq_avx512f(auVar15,auVar2);
      auVar22 = vmovdqa64_avx512f(auVar19);
      auVar22 = vpandq_avx512f(auVar22,auVar2);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar15 = vpaddb_avx512bw(auVar15,auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(2));
      auVar22 = vpandq_avx512f(auVar17,auVar2);
      auVar17 = vmovdqa64_avx512f(auVar19);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(2));
      auVar19 = vpandq_avx512f(auVar17,auVar2);
      auVar17 = vmovdqa64_avx512f(auVar22);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar17 = vpaddb_avx512bw(auVar17,auVar19);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar19 = vmovdqa64_avx512f(auVar21);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar21 = vmovdqa64_avx512f(auVar19);
      auVar21 = vpandq_avx512f(auVar21,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar20);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vpaddb_avx512bw(auVar21,auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar19,auVar3);
      auVar19 = vmovdqa64_avx512f(auVar20);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(4));
      auVar20 = vpandq_avx512f(auVar19,auVar3);
      auVar19 = vmovdqa64_avx512f(auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar19 = vpaddb_avx512bw(auVar19,auVar20);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar20 = vmovdqa64_avx512f(auVar10);
      auVar20 = vpandq_avx512f(auVar20,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar14);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar20 = vpaddb_avx512bw(auVar20,auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vpsrlw_avx512bw(auVar10,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar10,auVar3);
      auVar10 = vmovdqa64_avx512f(auVar14);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vpsrlw_avx512bw(auVar10,ZEXT416(4));
      auVar14 = vpandq_avx512f(auVar10,auVar3);
      auVar10 = vmovdqa64_avx512f(auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar10 = vpaddb_avx512bw(auVar10,auVar14);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar14 = vmovdqa64_avx512f(auVar18);
      auVar14 = vpandq_avx512f(auVar14,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar7);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar14 = vpaddb_avx512bw(auVar14,auVar22);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpsrlw_avx512bw(auVar18,ZEXT416(4));
      auVar18 = vpandq_avx512f(auVar18,auVar3);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar7,auVar3);
      auVar7 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar22);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar7 = vpaddb_avx512bw(auVar7,auVar18);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar18 = vmovdqa64_avx512f(auVar11);
      auVar18 = vpandq_avx512f(auVar18,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar15);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vpaddb_avx512bw(auVar18,auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar11,auVar3);
      auVar11 = vmovdqa64_avx512f(auVar15);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(4));
      auVar15 = vpandq_avx512f(auVar11,auVar3);
      auVar11 = vmovdqa64_avx512f(auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar11 = vpaddb_avx512bw(auVar11,auVar15);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar15 = vmovdqa64_avx512f(auVar6);
      auVar15 = vpandq_avx512f(auVar15,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar8);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar15 = vpaddb_avx512bw(auVar15,auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar6,auVar3);
      auVar6 = vmovdqa64_avx512f(auVar8);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(4));
      auVar8 = vpandq_avx512f(auVar6,auVar3);
      auVar6 = vmovdqa64_avx512f(auVar22);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar6 = vpaddb_avx512bw(auVar6,auVar8);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar8 = vmovdqa64_avx512f(auVar12);
      auVar8 = vpandq_avx512f(auVar8,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar16);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar8 = vpaddb_avx512bw(auVar8,auVar22);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar12,auVar3);
      auVar12 = vmovdqa64_avx512f(auVar16);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(4));
      auVar16 = vpandq_avx512f(auVar12,auVar3);
      auVar12 = vmovdqa64_avx512f(auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar12 = vpaddb_avx512bw(auVar12,auVar16);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar16 = vmovdqa64_avx512f(auVar5);
      auVar16 = vpandq_avx512f(auVar16,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar9);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar16 = vpaddb_avx512bw(auVar16,auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar5,auVar3);
      auVar5 = vmovdqa64_avx512f(auVar9);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(4));
      auVar9 = vpandq_avx512f(auVar5,auVar3);
      auVar5 = vmovdqa64_avx512f(auVar22);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar5 = vpaddb_avx512bw(auVar5,auVar9);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar9 = vmovdqa64_avx512f(auVar13);
      auVar9 = vpandq_avx512f(auVar9,auVar3);
      auVar22 = vmovdqa64_avx512f(auVar17);
      auVar22 = vpandq_avx512f(auVar22,auVar3);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar9 = vpaddb_avx512bw(auVar9,auVar22);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(4));
      auVar22 = vpandq_avx512f(auVar13,auVar3);
      auVar13 = vmovdqa64_avx512f(auVar17);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(4));
      auVar17 = vpandq_avx512f(auVar13,auVar3);
      auVar13 = vmovdqa64_avx512f(auVar22);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar13 = vpaddb_avx512bw(auVar13,auVar17);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar17 = vmovdqa64_avx512f(auVar21);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar21 = vmovdqa64_avx512f(auVar17);
      auVar21 = vpandq_avx512f(auVar21,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar20);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar21 = vpaddb_avx512bw(auVar21,auVar22);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar17,auVar4);
      auVar17 = vmovdqa64_avx512f(auVar20);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(8));
      auVar20 = vpandq_avx512f(auVar17,auVar4);
      auVar17 = vmovdqa64_avx512f(auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar17 = vpaddb_avx512bw(auVar17,auVar20);
      auVar17 = vmovdqa64_avx512f(auVar17);
      auVar20 = vmovdqa64_avx512f(auVar14);
      auVar20 = vpandq_avx512f(auVar20,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar18);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar20 = vpaddb_avx512bw(auVar20,auVar22);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpsrlw_avx512bw(auVar14,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar14,auVar4);
      auVar14 = vmovdqa64_avx512f(auVar18);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar14 = vpsrlw_avx512bw(auVar14,ZEXT416(8));
      auVar18 = vpandq_avx512f(auVar14,auVar4);
      auVar14 = vmovdqa64_avx512f(auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar14 = vpaddb_avx512bw(auVar14,auVar18);
      auVar14 = vmovdqa64_avx512f(auVar14);
      auVar18 = vmovdqa64_avx512f(auVar15);
      auVar18 = vpandq_avx512f(auVar18,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar8);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar18 = vpaddb_avx512bw(auVar18,auVar22);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar15 = vpsrlw_avx512bw(auVar15,ZEXT416(8));
      auVar15 = vpandq_avx512f(auVar15,auVar4);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar8 = vpsrlw_avx512bw(auVar8,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar8,auVar4);
      auVar8 = vmovdqa64_avx512f(auVar15);
      auVar15 = vmovdqa64_avx512f(auVar22);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar8 = vpaddb_avx512bw(auVar8,auVar15);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar15 = vmovdqa64_avx512f(auVar16);
      auVar15 = vpandq_avx512f(auVar15,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar9);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar15 = vpaddb_avx512bw(auVar15,auVar22);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar16 = vpsrlw_avx512bw(auVar16,ZEXT416(8));
      auVar16 = vpandq_avx512f(auVar16,auVar4);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar9,auVar4);
      auVar9 = vmovdqa64_avx512f(auVar16);
      auVar16 = vmovdqa64_avx512f(auVar22);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar9 = vpaddb_avx512bw(auVar9,auVar16);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar16 = vmovdqa64_avx512f(auVar19);
      auVar16 = vpandq_avx512f(auVar16,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar10);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar16 = vpaddb_avx512bw(auVar16,auVar22);
      auVar16 = vmovdqa64_avx512f(auVar16);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(8));
      auVar19 = vpandq_avx512f(auVar19,auVar4);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar10 = vpsrlw_avx512bw(auVar10,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar10,auVar4);
      auVar10 = vmovdqa64_avx512f(auVar19);
      auVar19 = vmovdqa64_avx512f(auVar22);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar10 = vpaddb_avx512bw(auVar10,auVar19);
      auVar10 = vmovdqa64_avx512f(auVar10);
      auVar19 = vmovdqa64_avx512f(auVar7);
      auVar19 = vpandq_avx512f(auVar19,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar11);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar19 = vpaddb_avx512bw(auVar19,auVar22);
      auVar19 = vmovdqa64_avx512f(auVar19);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar7,auVar4);
      auVar7 = vmovdqa64_avx512f(auVar11);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(8));
      auVar11 = vpandq_avx512f(auVar7,auVar4);
      auVar7 = vmovdqa64_avx512f(auVar22);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar7 = vpaddb_avx512bw(auVar7,auVar11);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar11 = vmovdqa64_avx512f(auVar6);
      auVar11 = vpandq_avx512f(auVar11,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar12);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar11 = vpaddb_avx512bw(auVar11,auVar22);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar6,auVar4);
      auVar6 = vmovdqa64_avx512f(auVar12);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(8));
      auVar12 = vpandq_avx512f(auVar6,auVar4);
      auVar6 = vmovdqa64_avx512f(auVar22);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar6 = vpaddb_avx512bw(auVar6,auVar12);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar12 = vmovdqa64_avx512f(auVar5);
      auVar12 = vpandq_avx512f(auVar12,auVar4);
      auVar22 = vmovdqa64_avx512f(auVar13);
      auVar22 = vpandq_avx512f(auVar22,auVar4);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar22 = vmovdqa64_avx512f(auVar22);
      auVar12 = vpaddb_avx512bw(auVar12,auVar22);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(8));
      auVar22 = vpandq_avx512f(auVar5,auVar4);
      auVar5 = vmovdqa64_avx512f(auVar13);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(8));
      auVar13 = vpandq_avx512f(auVar5,auVar4);
      auVar5 = vmovdqa64_avx512f(auVar22);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar5 = vpaddb_avx512bw(auVar5,auVar13);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar13 = vmovdqa64_avx512f(auVar21);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar20);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar18);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar15);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar16);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar19);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar11);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar12);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar17);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar14);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar8);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar9);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar10);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar7);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar6);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar5);
      vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_98c0);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar21 = vmovdqa64_avx512f(auVar21);
      auVar13 = vpaddw_avx512bw(auVar13,auVar21);
      local_98c0 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_9880);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar20 = vmovdqa64_avx512f(auVar20);
      auVar13 = vpaddw_avx512bw(auVar13,auVar20);
      local_9880 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_9840);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar18 = vmovdqa64_avx512f(auVar18);
      auVar13 = vpaddw_avx512bw(auVar13,auVar18);
      local_9840 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_9800);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vpaddw_avx512bw(auVar13,auVar15);
      local_9800 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_97c0);
      auVar15 = vmovdqa64_avx512f(auVar16);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vpaddw_avx512bw(auVar13,auVar15);
      local_97c0 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_9780);
      auVar15 = vmovdqa64_avx512f(auVar19);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar15 = vmovdqa64_avx512f(auVar15);
      auVar13 = vpaddw_avx512bw(auVar13,auVar15);
      local_9780 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(local_9740);
      auVar15 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar13);
      auVar13 = vmovdqa64_avx512f(auVar15);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar13 = vmovdqa64_avx512f(auVar13);
      auVar11 = vpaddw_avx512bw(auVar11,auVar13);
      local_9740 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(local_9700);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vpaddw_avx512bw(auVar11,auVar12);
      local_9700 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(local_96c0);
      auVar12 = vmovdqa64_avx512f(auVar17);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vpaddw_avx512bw(auVar11,auVar12);
      local_96c0 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(local_9680);
      auVar12 = vmovdqa64_avx512f(auVar14);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar12 = vmovdqa64_avx512f(auVar12);
      auVar11 = vpaddw_avx512bw(auVar11,auVar12);
      local_9680 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(local_9640);
      auVar12 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar11);
      auVar11 = vmovdqa64_avx512f(auVar12);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar11 = vmovdqa64_avx512f(auVar11);
      auVar8 = vpaddw_avx512bw(auVar8,auVar11);
      local_9640 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(local_9600);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar8 = vpaddw_avx512bw(auVar8,auVar9);
      local_9600 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(local_95c0);
      auVar9 = vmovdqa64_avx512f(auVar10);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar9 = vmovdqa64_avx512f(auVar9);
      auVar8 = vpaddw_avx512bw(auVar8,auVar9);
      local_95c0 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(local_9580);
      auVar9 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar8);
      auVar8 = vmovdqa64_avx512f(auVar9);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar8 = vmovdqa64_avx512f(auVar8);
      auVar7 = vpaddw_avx512bw(auVar7,auVar8);
      local_9580 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(local_9540);
      auVar8 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar7);
      auVar7 = vmovdqa64_avx512f(auVar8);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar7 = vmovdqa64_avx512f(auVar7);
      auVar6 = vpaddw_avx512bw(auVar6,auVar7);
      local_9540 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(local_9500);
      auVar7 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar6);
      auVar6 = vmovdqa64_avx512f(auVar7);
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar6 = vmovdqa64_avx512f(auVar6);
      auVar5 = vpaddw_avx512bw(auVar5,auVar6);
      local_9500 = vmovdqa64_avx512f(auVar5);
    }
    for (local_ae88 = 0; local_ae88 < 0x10; local_ae88 = local_ae88 + 1) {
      auVar5 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_98c0 + local_ae88 * 0x40));
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      local_9a50[0] = vmovdqu64_avx512f(auVar5);
      for (local_ae8c = 0; local_ae8c < 0x20; local_ae8c = local_ae8c + 1) {
        *(uint *)(in_RDX + local_ae88 * 4) =
             (uint)*(ushort *)(local_9a50[0] + (long)local_ae8c * 2) +
             *(int *)(in_RDX + local_ae88 * 4);
      }
    }
    for (local_ae98 = 0; local_ae98 < 0x10; local_ae98 = local_ae98 + 1) {
      auVar5 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar5 = vmovdqa64_avx512f(auVar5);
      auVar5 = vmovdqa64_avx512f(auVar5);
      *(undefined1 (*) [64])(local_98c0 + local_ae98 * 0x40) = auVar5;
    }
  }
  for (local_9a58 = local_9a58 << 0xb; local_9a58 < in_ESI >> 9; local_9a58 = local_9a58 + 1) {
    auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400));
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x40));
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x80));
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0xc0));
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x100));
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x140));
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar11 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x180));
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x1c0));
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar13 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x200));
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar14 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x240));
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x280));
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar16 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x2c0));
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar17 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x300));
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar18 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x340));
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar19 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x380));
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar20 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in_RDI + local_9a58 * 0x400 + 0x3c0));
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar21 = vmovdqa64_avx512f(auVar5);
    auVar21 = vpandq_avx512f(auVar21,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar6);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vpaddb_avx512bw(auVar21,auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar5,auVar1);
    auVar5 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(1));
    auVar6 = vpandq_avx512f(auVar5,auVar1);
    auVar5 = vmovdqa64_avx512f(auVar22);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vpaddb_avx512bw(auVar5,auVar6);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar7);
    auVar6 = vpandq_avx512f(auVar6,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar8);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar6 = vpaddb_avx512bw(auVar6,auVar22);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar7,auVar1);
    auVar7 = vmovdqa64_avx512f(auVar8);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(1));
    auVar8 = vpandq_avx512f(auVar7,auVar1);
    auVar7 = vmovdqa64_avx512f(auVar22);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar7 = vpaddb_avx512bw(auVar7,auVar8);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar8 = vpandq_avx512f(auVar8,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar10);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar8 = vpaddb_avx512bw(auVar8,auVar22);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar9,auVar1);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(1));
    auVar10 = vpandq_avx512f(auVar9,auVar1);
    auVar9 = vmovdqa64_avx512f(auVar22);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar9 = vpaddb_avx512bw(auVar9,auVar10);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar10 = vmovdqa64_avx512f(auVar11);
    auVar10 = vpandq_avx512f(auVar10,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar12);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar10 = vpaddb_avx512bw(auVar10,auVar22);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar11,auVar1);
    auVar11 = vmovdqa64_avx512f(auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(1));
    auVar12 = vpandq_avx512f(auVar11,auVar1);
    auVar11 = vmovdqa64_avx512f(auVar22);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vpaddb_avx512bw(auVar11,auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar13);
    auVar12 = vpandq_avx512f(auVar12,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar14);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar12 = vpaddb_avx512bw(auVar12,auVar22);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar13,auVar1);
    auVar13 = vmovdqa64_avx512f(auVar14);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(1));
    auVar14 = vpandq_avx512f(auVar13,auVar1);
    auVar13 = vmovdqa64_avx512f(auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar13 = vpaddb_avx512bw(auVar13,auVar14);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar14 = vmovdqa64_avx512f(auVar15);
    auVar14 = vpandq_avx512f(auVar14,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar16);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar14 = vpaddb_avx512bw(auVar14,auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vpsrlw_avx512bw(auVar15,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar15,auVar1);
    auVar15 = vmovdqa64_avx512f(auVar16);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vpsrlw_avx512bw(auVar15,ZEXT416(1));
    auVar16 = vpandq_avx512f(auVar15,auVar1);
    auVar15 = vmovdqa64_avx512f(auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar15 = vpaddb_avx512bw(auVar15,auVar16);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar16 = vmovdqa64_avx512f(auVar17);
    auVar16 = vpandq_avx512f(auVar16,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar18);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar16 = vpaddb_avx512bw(auVar16,auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar17,auVar1);
    auVar17 = vmovdqa64_avx512f(auVar18);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(1));
    auVar18 = vpandq_avx512f(auVar17,auVar1);
    auVar17 = vmovdqa64_avx512f(auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar17 = vpaddb_avx512bw(auVar17,auVar18);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar18 = vmovdqa64_avx512f(auVar19);
    auVar18 = vpandq_avx512f(auVar18,auVar1);
    auVar22 = vmovdqa64_avx512f(auVar20);
    auVar22 = vpandq_avx512f(auVar22,auVar1);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vpaddb_avx512bw(auVar18,auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(1));
    auVar22 = vpandq_avx512f(auVar19,auVar1);
    auVar19 = vmovdqa64_avx512f(auVar20);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(1));
    auVar20 = vpandq_avx512f(auVar19,auVar1);
    auVar19 = vmovdqa64_avx512f(auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar19 = vpaddb_avx512bw(auVar19,auVar20);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar20 = vmovdqa64_avx512f(auVar21);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar21 = vmovdqa64_avx512f(auVar20);
    auVar21 = vpandq_avx512f(auVar21,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar6);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vpaddb_avx512bw(auVar21,auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vpsrlw_avx512bw(auVar20,ZEXT416(2));
    auVar20 = vpandq_avx512f(auVar20,auVar2);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar6,auVar2);
    auVar6 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar22);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar6 = vpaddb_avx512bw(auVar6,auVar20);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar20 = vmovdqa64_avx512f(auVar8);
    auVar20 = vpandq_avx512f(auVar20,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar10);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar20 = vpaddb_avx512bw(auVar20,auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vpsrlw_avx512bw(auVar8,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar8,auVar2);
    auVar8 = vmovdqa64_avx512f(auVar10);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vpsrlw_avx512bw(auVar8,ZEXT416(2));
    auVar10 = vpandq_avx512f(auVar8,auVar2);
    auVar8 = vmovdqa64_avx512f(auVar22);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar8 = vpaddb_avx512bw(auVar8,auVar10);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar10 = vmovdqa64_avx512f(auVar12);
    auVar10 = vpandq_avx512f(auVar10,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar14);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar10 = vpaddb_avx512bw(auVar10,auVar22);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar12,auVar2);
    auVar12 = vmovdqa64_avx512f(auVar14);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(2));
    auVar14 = vpandq_avx512f(auVar12,auVar2);
    auVar12 = vmovdqa64_avx512f(auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar12 = vpaddb_avx512bw(auVar12,auVar14);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar14 = vmovdqa64_avx512f(auVar16);
    auVar14 = vpandq_avx512f(auVar14,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar18);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar14 = vpaddb_avx512bw(auVar14,auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vpsrlw_avx512bw(auVar16,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar16,auVar2);
    auVar16 = vmovdqa64_avx512f(auVar18);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vpsrlw_avx512bw(auVar16,ZEXT416(2));
    auVar18 = vpandq_avx512f(auVar16,auVar2);
    auVar16 = vmovdqa64_avx512f(auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar16 = vpaddb_avx512bw(auVar16,auVar18);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar18 = vmovdqa64_avx512f(auVar5);
    auVar18 = vpandq_avx512f(auVar18,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar7);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vpaddb_avx512bw(auVar18,auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar5,auVar2);
    auVar5 = vmovdqa64_avx512f(auVar7);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(2));
    auVar7 = vpandq_avx512f(auVar5,auVar2);
    auVar5 = vmovdqa64_avx512f(auVar22);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar5 = vpaddb_avx512bw(auVar5,auVar7);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar7 = vmovdqa64_avx512f(auVar9);
    auVar7 = vpandq_avx512f(auVar7,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar11);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar7 = vpaddb_avx512bw(auVar7,auVar22);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar9,auVar2);
    auVar9 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(2));
    auVar11 = vpandq_avx512f(auVar9,auVar2);
    auVar9 = vmovdqa64_avx512f(auVar22);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar9 = vpaddb_avx512bw(auVar9,auVar11);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar11 = vmovdqa64_avx512f(auVar13);
    auVar11 = vpandq_avx512f(auVar11,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar15);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar11 = vpaddb_avx512bw(auVar11,auVar22);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar13,auVar2);
    auVar13 = vmovdqa64_avx512f(auVar15);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(2));
    auVar15 = vpandq_avx512f(auVar13,auVar2);
    auVar13 = vmovdqa64_avx512f(auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vpaddb_avx512bw(auVar13,auVar15);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar17);
    auVar15 = vpandq_avx512f(auVar15,auVar2);
    auVar22 = vmovdqa64_avx512f(auVar19);
    auVar22 = vpandq_avx512f(auVar22,auVar2);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar15 = vpaddb_avx512bw(auVar15,auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(2));
    auVar22 = vpandq_avx512f(auVar17,auVar2);
    auVar17 = vmovdqa64_avx512f(auVar19);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(2));
    auVar19 = vpandq_avx512f(auVar17,auVar2);
    auVar17 = vmovdqa64_avx512f(auVar22);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar17 = vpaddb_avx512bw(auVar17,auVar19);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar19 = vmovdqa64_avx512f(auVar21);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar21 = vmovdqa64_avx512f(auVar19);
    auVar21 = vpandq_avx512f(auVar21,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar20);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vpaddb_avx512bw(auVar21,auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar19,auVar3);
    auVar19 = vmovdqa64_avx512f(auVar20);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(4));
    auVar20 = vpandq_avx512f(auVar19,auVar3);
    auVar19 = vmovdqa64_avx512f(auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar19 = vpaddb_avx512bw(auVar19,auVar20);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar20 = vmovdqa64_avx512f(auVar10);
    auVar20 = vpandq_avx512f(auVar20,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar14);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar20 = vpaddb_avx512bw(auVar20,auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vpsrlw_avx512bw(auVar10,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar10,auVar3);
    auVar10 = vmovdqa64_avx512f(auVar14);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vpsrlw_avx512bw(auVar10,ZEXT416(4));
    auVar14 = vpandq_avx512f(auVar10,auVar3);
    auVar10 = vmovdqa64_avx512f(auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar10 = vpaddb_avx512bw(auVar10,auVar14);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar14 = vmovdqa64_avx512f(auVar18);
    auVar14 = vpandq_avx512f(auVar14,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar7);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar14 = vpaddb_avx512bw(auVar14,auVar22);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar18 = vpsrlw_avx512bw(auVar18,ZEXT416(4));
    auVar18 = vpandq_avx512f(auVar18,auVar3);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar7,auVar3);
    auVar7 = vmovdqa64_avx512f(auVar18);
    auVar18 = vmovdqa64_avx512f(auVar22);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar7 = vpaddb_avx512bw(auVar7,auVar18);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar18 = vmovdqa64_avx512f(auVar11);
    auVar18 = vpandq_avx512f(auVar18,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar15);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vpaddb_avx512bw(auVar18,auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar11,auVar3);
    auVar11 = vmovdqa64_avx512f(auVar15);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vpsrlw_avx512bw(auVar11,ZEXT416(4));
    auVar15 = vpandq_avx512f(auVar11,auVar3);
    auVar11 = vmovdqa64_avx512f(auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar11 = vpaddb_avx512bw(auVar11,auVar15);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar15 = vmovdqa64_avx512f(auVar6);
    auVar15 = vpandq_avx512f(auVar15,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar8);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar15 = vpaddb_avx512bw(auVar15,auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar6,auVar3);
    auVar6 = vmovdqa64_avx512f(auVar8);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(4));
    auVar8 = vpandq_avx512f(auVar6,auVar3);
    auVar6 = vmovdqa64_avx512f(auVar22);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar6 = vpaddb_avx512bw(auVar6,auVar8);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar8 = vmovdqa64_avx512f(auVar12);
    auVar8 = vpandq_avx512f(auVar8,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar16);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar8 = vpaddb_avx512bw(auVar8,auVar22);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar12,auVar3);
    auVar12 = vmovdqa64_avx512f(auVar16);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vpsrlw_avx512bw(auVar12,ZEXT416(4));
    auVar16 = vpandq_avx512f(auVar12,auVar3);
    auVar12 = vmovdqa64_avx512f(auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar12 = vpaddb_avx512bw(auVar12,auVar16);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar16 = vmovdqa64_avx512f(auVar5);
    auVar16 = vpandq_avx512f(auVar16,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar9);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar16 = vpaddb_avx512bw(auVar16,auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar5,auVar3);
    auVar5 = vmovdqa64_avx512f(auVar9);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(4));
    auVar9 = vpandq_avx512f(auVar5,auVar3);
    auVar5 = vmovdqa64_avx512f(auVar22);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar5 = vpaddb_avx512bw(auVar5,auVar9);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar9 = vmovdqa64_avx512f(auVar13);
    auVar9 = vpandq_avx512f(auVar9,auVar3);
    auVar22 = vmovdqa64_avx512f(auVar17);
    auVar22 = vpandq_avx512f(auVar22,auVar3);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar9 = vpaddb_avx512bw(auVar9,auVar22);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(4));
    auVar22 = vpandq_avx512f(auVar13,auVar3);
    auVar13 = vmovdqa64_avx512f(auVar17);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vpsrlw_avx512bw(auVar13,ZEXT416(4));
    auVar17 = vpandq_avx512f(auVar13,auVar3);
    auVar13 = vmovdqa64_avx512f(auVar22);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar13 = vpaddb_avx512bw(auVar13,auVar17);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar17 = vmovdqa64_avx512f(auVar21);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar21 = vmovdqa64_avx512f(auVar17);
    auVar21 = vpandq_avx512f(auVar21,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar20);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar21 = vpaddb_avx512bw(auVar21,auVar22);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar17,auVar4);
    auVar17 = vmovdqa64_avx512f(auVar20);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar17 = vpsrlw_avx512bw(auVar17,ZEXT416(8));
    auVar20 = vpandq_avx512f(auVar17,auVar4);
    auVar17 = vmovdqa64_avx512f(auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar17 = vpaddb_avx512bw(auVar17,auVar20);
    auVar17 = vmovdqa64_avx512f(auVar17);
    auVar20 = vmovdqa64_avx512f(auVar14);
    auVar20 = vpandq_avx512f(auVar20,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar18);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar20 = vpaddb_avx512bw(auVar20,auVar22);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vpsrlw_avx512bw(auVar14,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar14,auVar4);
    auVar14 = vmovdqa64_avx512f(auVar18);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar14 = vpsrlw_avx512bw(auVar14,ZEXT416(8));
    auVar18 = vpandq_avx512f(auVar14,auVar4);
    auVar14 = vmovdqa64_avx512f(auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar14 = vpaddb_avx512bw(auVar14,auVar18);
    auVar14 = vmovdqa64_avx512f(auVar14);
    auVar18 = vmovdqa64_avx512f(auVar15);
    auVar18 = vpandq_avx512f(auVar18,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar8);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar18 = vpaddb_avx512bw(auVar18,auVar22);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar15 = vpsrlw_avx512bw(auVar15,ZEXT416(8));
    auVar15 = vpandq_avx512f(auVar15,auVar4);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar8 = vpsrlw_avx512bw(auVar8,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar8,auVar4);
    auVar8 = vmovdqa64_avx512f(auVar15);
    auVar15 = vmovdqa64_avx512f(auVar22);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar8 = vpaddb_avx512bw(auVar8,auVar15);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar15 = vmovdqa64_avx512f(auVar16);
    auVar15 = vpandq_avx512f(auVar15,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar9);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar15 = vpaddb_avx512bw(auVar15,auVar22);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar16 = vpsrlw_avx512bw(auVar16,ZEXT416(8));
    auVar16 = vpandq_avx512f(auVar16,auVar4);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar9 = vpsrlw_avx512bw(auVar9,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar9,auVar4);
    auVar9 = vmovdqa64_avx512f(auVar16);
    auVar16 = vmovdqa64_avx512f(auVar22);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar9 = vpaddb_avx512bw(auVar9,auVar16);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar16 = vmovdqa64_avx512f(auVar19);
    auVar16 = vpandq_avx512f(auVar16,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar10);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar16 = vpaddb_avx512bw(auVar16,auVar22);
    auVar16 = vmovdqa64_avx512f(auVar16);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar19 = vpsrlw_avx512bw(auVar19,ZEXT416(8));
    auVar19 = vpandq_avx512f(auVar19,auVar4);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar10 = vpsrlw_avx512bw(auVar10,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar10,auVar4);
    auVar10 = vmovdqa64_avx512f(auVar19);
    auVar19 = vmovdqa64_avx512f(auVar22);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar10 = vpaddb_avx512bw(auVar10,auVar19);
    auVar10 = vmovdqa64_avx512f(auVar10);
    auVar19 = vmovdqa64_avx512f(auVar7);
    auVar19 = vpandq_avx512f(auVar19,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar11);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar19 = vpaddb_avx512bw(auVar19,auVar22);
    auVar19 = vmovdqa64_avx512f(auVar19);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar7,auVar4);
    auVar7 = vmovdqa64_avx512f(auVar11);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar7 = vpsrlw_avx512bw(auVar7,ZEXT416(8));
    auVar11 = vpandq_avx512f(auVar7,auVar4);
    auVar7 = vmovdqa64_avx512f(auVar22);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar7 = vpaddb_avx512bw(auVar7,auVar11);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar11 = vmovdqa64_avx512f(auVar6);
    auVar11 = vpandq_avx512f(auVar11,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar12);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar11 = vpaddb_avx512bw(auVar11,auVar22);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar6,auVar4);
    auVar6 = vmovdqa64_avx512f(auVar12);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar6 = vpsrlw_avx512bw(auVar6,ZEXT416(8));
    auVar12 = vpandq_avx512f(auVar6,auVar4);
    auVar6 = vmovdqa64_avx512f(auVar22);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar6 = vpaddb_avx512bw(auVar6,auVar12);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar12 = vmovdqa64_avx512f(auVar5);
    auVar12 = vpandq_avx512f(auVar12,auVar4);
    auVar22 = vmovdqa64_avx512f(auVar13);
    auVar22 = vpandq_avx512f(auVar22,auVar4);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar22 = vmovdqa64_avx512f(auVar22);
    auVar12 = vpaddb_avx512bw(auVar12,auVar22);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(8));
    auVar22 = vpandq_avx512f(auVar5,auVar4);
    auVar5 = vmovdqa64_avx512f(auVar13);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar5 = vpsrlw_avx512bw(auVar5,ZEXT416(8));
    auVar13 = vpandq_avx512f(auVar5,auVar4);
    auVar5 = vmovdqa64_avx512f(auVar22);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar5 = vpaddb_avx512bw(auVar5,auVar13);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar13 = vmovdqa64_avx512f(auVar21);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar20);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar18);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar15);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar16);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar19);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar11);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar12);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar17);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar14);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar8);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar9);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar10);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar7);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar6);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar5);
    vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(local_98c0);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar21 = vmovdqa64_avx512f(auVar21);
    auVar13 = vpaddw_avx512bw(auVar13,auVar21);
    local_98c0 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(local_9880);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar20 = vmovdqa64_avx512f(auVar20);
    auVar13 = vpaddw_avx512bw(auVar13,auVar20);
    local_9880 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(local_9840);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar18 = vmovdqa64_avx512f(auVar18);
    auVar13 = vpaddw_avx512bw(auVar13,auVar18);
    local_9840 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(local_9800);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vpaddw_avx512bw(auVar13,auVar15);
    local_9800 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(local_97c0);
    auVar15 = vmovdqa64_avx512f(auVar16);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vpaddw_avx512bw(auVar13,auVar15);
    local_97c0 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(local_9780);
    auVar15 = vmovdqa64_avx512f(auVar19);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar15 = vmovdqa64_avx512f(auVar15);
    auVar13 = vpaddw_avx512bw(auVar13,auVar15);
    local_9780 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(local_9740);
    auVar15 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar13);
    auVar13 = vmovdqa64_avx512f(auVar15);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar13 = vmovdqa64_avx512f(auVar13);
    auVar11 = vpaddw_avx512bw(auVar11,auVar13);
    local_9740 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(local_9700);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vpaddw_avx512bw(auVar11,auVar12);
    local_9700 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(local_96c0);
    auVar12 = vmovdqa64_avx512f(auVar17);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vpaddw_avx512bw(auVar11,auVar12);
    local_96c0 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(local_9680);
    auVar12 = vmovdqa64_avx512f(auVar14);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar12 = vmovdqa64_avx512f(auVar12);
    auVar11 = vpaddw_avx512bw(auVar11,auVar12);
    local_9680 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(local_9640);
    auVar12 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar11);
    auVar11 = vmovdqa64_avx512f(auVar12);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar11 = vmovdqa64_avx512f(auVar11);
    auVar8 = vpaddw_avx512bw(auVar8,auVar11);
    local_9640 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(local_9600);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vpaddw_avx512bw(auVar8,auVar9);
    local_9600 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(local_95c0);
    auVar9 = vmovdqa64_avx512f(auVar10);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar9 = vmovdqa64_avx512f(auVar9);
    auVar8 = vpaddw_avx512bw(auVar8,auVar9);
    local_95c0 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(local_9580);
    auVar9 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar8);
    auVar8 = vmovdqa64_avx512f(auVar9);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar8 = vmovdqa64_avx512f(auVar8);
    auVar7 = vpaddw_avx512bw(auVar7,auVar8);
    local_9580 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(local_9540);
    auVar8 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar7);
    auVar7 = vmovdqa64_avx512f(auVar8);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar7 = vmovdqa64_avx512f(auVar7);
    auVar6 = vpaddw_avx512bw(auVar6,auVar7);
    local_9540 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(local_9500);
    auVar7 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(auVar6);
    auVar6 = vmovdqa64_avx512f(auVar7);
    auVar5 = vmovdqa64_avx512f(auVar5);
    auVar6 = vmovdqa64_avx512f(auVar6);
    auVar5 = vpaddw_avx512bw(auVar5,auVar6);
    local_9500 = vmovdqa64_avx512f(auVar5);
  }
  for (local_9a58 = local_9a58 << 9; local_9a58 < in_ESI; local_9a58 = local_9a58 + 1) {
    for (local_c2c4 = 0; local_c2c4 < 0x10; local_c2c4 = local_c2c4 + 1) {
      *(int *)(in_RDX + (long)local_c2c4 * 4) =
           ((int)((uint)*(ushort *)(in_RDI + local_9a58 * 2) & 1 << ((byte)local_c2c4 & 0x1f)) >>
           ((byte)local_c2c4 & 0x1f)) + *(int *)(in_RDX + (long)local_c2c4 * 4);
    }
  }
  for (local_c2d0 = 0; local_c2d0 < 0x10; local_c2d0 = local_c2d0 + 1) {
    auVar1 = vmovdqa64_avx512f(*(undefined1 (*) [64])(local_98c0 + local_c2d0 * 0x40));
    auVar1 = vmovdqa64_avx512f(auVar1);
    auVar1 = vmovdqa64_avx512f(auVar1);
    local_9a50[0] = vmovdqu64_avx512f(auVar1);
    for (local_c2d4 = 0; local_c2d4 < 0x20; local_c2d4 = local_c2d4 + 1) {
      *(uint *)(in_RDX + local_c2d0 * 4) =
           (uint)*(ushort *)(local_9a50[0] + (long)local_c2d4 * 2) +
           *(int *)(in_RDX + local_c2d0 * 4);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx512bw_adder_forest(const uint16_t* array, uint32_t len, uint32_t* flags) {
    __m512i counters[16];

    for (size_t i = 0; i < 16; ++i) {
        counters[i] = _mm512_setzero_si512();
    }

    const __m512i mask1bit = _mm512_set1_epi16(0x5555); // 0101010101010101 Pattern: 01
    const __m512i mask2bit = _mm512_set1_epi16(0x3333); // 0011001100110011 Pattern: 0011
    const __m512i mask4bit = _mm512_set1_epi16(0x0F0F); // 0000111100001111 Pattern: 00001111
    const __m512i mask8bit = _mm512_set1_epi16(0x00FF); // 0000000011111111 Pattern: 0000000011111111
    
    const uint32_t n_cycles = len / (2048 * (16*32));
    const uint32_t n_total  = len / (16*32);
    uint16_t tmp[32];

/*------ Macros --------*/
#define LE(i,p,k)  const __m512i sum##p##k##_##i##bit_even = _mm512_add_epi8(input##p & mask##i##bit, input##k & mask##i##bit);
#define LO(i,p,k)  const __m512i sum##p##k##_##i##bit_odd  = _mm512_add_epi8(_mm512_srli_epi16(input##p, i) & mask##i##bit, _mm512_srli_epi16(input##k, i) & mask##i##bit);

#define LBLOCK(i)           \
    LE(i,0,1)   LO(i,0,1)   \
    LE(i,2,3)   LO(i,2,3)   \
    LE(i,4,5)   LO(i,4,5)   \
    LE(i,6,7)   LO(i,6,7)   \
    LE(i,8,9)   LO(i,8,9)   \
    LE(i,10,11) LO(i,10,11) \
    LE(i,12,13) LO(i,12,13) \
    LE(i,14,15) LO(i,14,15) \

#define EVEN(b,i,k,p) input##i = sum##k##p##_##b##bit_even;
#define ODD(b,i,k,p)  input##i = sum##k##p##_##b##bit_odd;

#define UPDATE(i)                                                  \
    EVEN(i,0,0,1) EVEN(i,1,2,3)   EVEN(i,2,4,5)   EVEN(i,3,6,7)    \
    EVEN(i,4,8,9) EVEN(i,5,10,11) EVEN(i,6,12,13) EVEN(i,7,14,15)  \
     ODD(i,8,0,1)  ODD(i,9,2,3)    ODD(i,10,4,5)   ODD(i,11,6,7)   \
     ODD(i,12,8,9) ODD(i,13,10,11) ODD(i,14,12,13) ODD(i,15,14,15) \

#define UE(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_even);
#define UO(i,p,k) counters[i] = _mm512_add_epi16(counters[i], sum##p##k##_8bit_odd);

/*------ Start --------*/
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*2048*512 + j*512 + p*32));
    size_t i = 0;
    for (/**/; i < n_cycles; ++i) {
        for (int j = 0; j < 2048; ++j) {
            // Load 16 registers.
            L(0)  L(1)  L(2)  L(3)  
            L(4)  L(5)  L(6)  L(7) 
            L(8)  L(9)  L(10) L(11) 
            L(12) L(13) L(14) L(15)

            // Perform updates for bits {1,2,4,8}.
            LBLOCK(1) UPDATE(1)
            LBLOCK(2) UPDATE(2)
            LBLOCK(4) UPDATE(4)
            LBLOCK(8) UPDATE(8)

            // Update accumulators.
            UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
            UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
            UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
            UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
        }

        // Update.
        for (size_t i = 0; i < 16; ++i) {
            _mm512_storeu_si512((__m512i*)tmp, counters[i]);
            for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
        }
        // Reset.
        for (size_t i = 0; i < 16; ++i) {
            counters[i] = _mm512_setzero_si512();
        }
    }
#undef L
#define L(p) __m512i input##p = _mm512_loadu_si512((__m512i*)(array + i*512 + p*32));
    i *= 2048;
    for (/**/; i < n_total; ++i) {
        // Load 16 registers.
        L(0)  L(1)  L(2)  L(3)  
        L(4)  L(5)  L(6)  L(7) 
        L(8)  L(9)  L(10) L(11) 
        L(12) L(13) L(14) L(15)

        // Perform updates for bits {1,2,4,8}.
        LBLOCK(1) UPDATE(1)
        LBLOCK(2) UPDATE(2)
        LBLOCK(4) UPDATE(4)
        LBLOCK(8) UPDATE(8)

        // Update accumulators.
        UE( 0,0,1) UE( 1, 2, 3) UE( 2, 4, 5) UE( 3, 6, 7)  
        UE( 4,8,9) UE( 5,10,11) UE( 6,12,13) UE( 7,14,15) 
        UO( 8,0,1) UO( 9, 2, 3) UO(10, 4, 5) UO(11, 6, 7) 
        UO(12,8,9) UO(13,10,11) UO(14,12,13) UO(15,14,15)
    }

    i *= 512;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef UPDATE
#undef ODD
#undef EVEN
#undef LBLOCK
#undef LE
#undef LO
#undef UO
#undef UE

    for (size_t i = 0; i < 16; ++i) {
        _mm512_storeu_si512((__m512i*)tmp, counters[i]);
        for (int j = 0; j < 32; ++j) flags[i] += tmp[j];
    }
    return 0;
}